

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_MSIRP(TT_ExecContext exc,FT_Long *args)

{
  ulong uVar1;
  ushort uVar2;
  FT_Vector *pFVar3;
  FT_F26Dot6 FVar4;
  FT_Vector *pFVar5;
  FT_F26Dot6 distance;
  FT_UShort point;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  uVar1 = *args;
  uVar2 = (ushort)uVar1;
  if ((uVar2 < (exc->zp1).n_points) && ((exc->GS).rp0 < (exc->zp0).n_points)) {
    if ((exc->GS).gep1 == 0) {
      pFVar3 = (exc->zp1).org + (uVar1 & 0xffff);
      pFVar5 = (exc->zp0).org + (exc->GS).rp0;
      pFVar3->x = pFVar5->x;
      pFVar3->y = pFVar5->y;
      (*exc->func_move_orig)(exc,&exc->zp1,uVar2,args[1]);
      pFVar3 = (exc->zp1).cur + (uVar1 & 0xffff);
      pFVar5 = (exc->zp1).org + (uVar1 & 0xffff);
      pFVar3->x = pFVar5->x;
      pFVar3->y = pFVar5->y;
    }
    FVar4 = (*exc->func_project)
                      (exc,(exc->zp1).cur[(int)(uint)uVar2].x -
                           (exc->zp0).cur[(int)(uint)(exc->GS).rp0].x,
                       (exc->zp1).cur[(int)(uint)uVar2].y -
                       (exc->zp0).cur[(int)(uint)(exc->GS).rp0].y);
    (*exc->func_move)(exc,&exc->zp1,uVar2,args[1] - FVar4);
    (exc->GS).rp1 = (exc->GS).rp0;
    (exc->GS).rp2 = uVar2;
    if ((exc->opcode & 1) != 0) {
      (exc->GS).rp0 = uVar2;
    }
  }
  else if (exc->pedantic_hinting != '\0') {
    exc->error = 0x86;
  }
  return;
}

Assistant:

static void
  Ins_MSIRP( TT_ExecContext  exc,
             FT_Long*        args )
  {
    FT_UShort   point = 0;
    FT_F26Dot6  distance;


    point = (FT_UShort)args[0];

    if ( BOUNDS( point,       exc->zp1.n_points ) ||
         BOUNDS( exc->GS.rp0, exc->zp0.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      return;
    }

    /* UNDOCUMENTED!  The MS rasterizer does that with */
    /* twilight points (confirmed by Greg Hitchcock)   */
    if ( exc->GS.gep1 == 0 )
    {
      exc->zp1.org[point] = exc->zp0.org[exc->GS.rp0];
      exc->func_move_orig( exc, &exc->zp1, point, args[1] );
      exc->zp1.cur[point] = exc->zp1.org[point];
    }

    distance = PROJECT( exc->zp1.cur + point, exc->zp0.cur + exc->GS.rp0 );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    /* subpixel hinting - make MSIRP respect CVT cut-in; */
    if ( SUBPIXEL_HINTING_INFINALITY &&
         exc->ignore_x_mode          &&
         exc->GS.freeVector.x != 0   )
    {
      FT_F26Dot6  control_value_cutin = exc->GS.control_value_cutin;
      FT_F26Dot6  delta;


      if ( !( exc->sph_tweak_flags & SPH_TWEAK_NORMAL_ROUND ) )
        control_value_cutin = 0;

      delta = SUB_LONG( distance, args[1] );
      if ( delta < 0 )
        delta = NEG_LONG( delta );

      if ( delta >= control_value_cutin )
        distance = args[1];
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    exc->func_move( exc,
                    &exc->zp1,
                    point,
                    SUB_LONG( args[1], distance ) );

    exc->GS.rp1 = exc->GS.rp0;
    exc->GS.rp2 = point;

    if ( ( exc->opcode & 1 ) != 0 )
      exc->GS.rp0 = point;
  }